

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O0

RPCHelpMan * wallet::setlabel(void)

{
  initializer_list<RPCArg> __l;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff818;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffff820;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff850;
  allocator<char> *in_stack_fffffffffffff858;
  iterator in_stack_fffffffffffff860;
  undefined1 *puVar2;
  RPCArgOptions *in_stack_fffffffffffff868;
  string *in_stack_fffffffffffff870;
  Fallback *in_stack_fffffffffffff878;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff880;
  string *in_stack_fffffffffffff888;
  string *description;
  RPCArg *in_stack_fffffffffffff890;
  RPCResult *result;
  RPCResults *this_00;
  RPCResult *this_01;
  allocator<char> local_6aa;
  allocator<char> local_6a9;
  _Alloc_hider local_6a8;
  pointer examples;
  undefined8 results;
  undefined8 in_stack_fffffffffffff970;
  undefined8 in_stack_fffffffffffff978;
  undefined8 in_stack_fffffffffffff980;
  undefined8 in_stack_fffffffffffff988;
  undefined1 local_662 [8];
  allocator<char> local_65a;
  allocator<char> local_659 [8];
  allocator<char> local_651 [31];
  allocator<char> local_632;
  allocator<char> local_631 [177];
  RPCMethodImpl *in_stack_fffffffffffffa80;
  undefined1 local_258 [528];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff868,(char *)in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff868,(char *)in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff868,(char *)in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  local_659[1] = (allocator<char>)0x0;
  local_659[2] = (allocator<char>)0x0;
  local_659[3] = (allocator<char>)0x0;
  local_659[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff828,(Optional *)in_stack_fffffffffffff820);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff868,(char *)in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::__cxx11::string::string(in_stack_fffffffffffff830);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff818);
  RPCArg::RPCArg(in_stack_fffffffffffff890,in_stack_fffffffffffff888,
                 (Type)((ulong)in_stack_fffffffffffff880 >> 0x20),in_stack_fffffffffffff878,
                 in_stack_fffffffffffff870,in_stack_fffffffffffff868);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff868,(char *)in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  local_662._2_4_ = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff828,(Optional *)in_stack_fffffffffffff820);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff868,(char *)in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::__cxx11::string::string(in_stack_fffffffffffff830);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff818);
  RPCArg::RPCArg(in_stack_fffffffffffff890,in_stack_fffffffffffff888,
                 (Type)((ulong)in_stack_fffffffffffff880 >> 0x20),in_stack_fffffffffffff878,
                 in_stack_fffffffffffff870,in_stack_fffffffffffff868);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffff878 >> 0x38);
  this_01 = (RPCResult *)local_662;
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff818);
  __l._M_len = (size_type)in_stack_fffffffffffff868;
  __l._M_array = in_stack_fffffffffffff860;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff858,__l,
             (allocator_type *)in_stack_fffffffffffff850);
  this_00 = (RPCResults *)&stack0xfffffffffffff97f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff868,(char *)in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  result = (RPCResult *)&stack0xfffffffffffff97e;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff868,(char *)in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  local_6a8._M_p = (pointer)0x0;
  examples = (pointer)0x0;
  results = (RPCResults *)0x0;
  description = (string *)&local_6a8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff818);
  RPCResult::RPCResult
            (this_01,(Type)((ulong)this_00 >> 0x20),(string *)result,description,
             in_stack_fffffffffffff880,(bool)skip_type_check);
  RPCResults::RPCResults(this_00,result);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff868,(char *)in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::operator+(&in_stack_fffffffffffff868->skip_type_check,&in_stack_fffffffffffff860->m_names);
  std::operator+(in_stack_fffffffffffff830,(char *)in_stack_fffffffffffff828);
  HelpExampleCli(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff868,(char *)in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::operator+(&in_stack_fffffffffffff868->skip_type_check,&in_stack_fffffffffffff860->m_names);
  std::operator+(in_stack_fffffffffffff830,(char *)in_stack_fffffffffffff828);
  HelpExampleRpc(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  std::operator+(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff818,(string *)0x17d02f1);
  this = (RPCArg *)&stack0xfffffffffffff930;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::setlabel()::__0,void>(in_stack_fffffffffffff828,in_stack_fffffffffffff820);
  RPCHelpMan::RPCHelpMan
            ((RPCHelpMan *)in_stack_fffffffffffff988,(string *)in_stack_fffffffffffff980,
             (string *)in_stack_fffffffffffff978,
             (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff970,
             (RPCResults *)results,(RPCExamples *)examples,in_stack_fffffffffffffa80);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_6aa);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_6a9);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff828);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff97e);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff97f);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff828);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_258;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_662 + 1));
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_65a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_659);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_651);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_632);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_631);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan setlabel()
{
    return RPCHelpMan{"setlabel",
                "\nSets the label associated with the given address.\n",
                {
                    {"address", RPCArg::Type::STR, RPCArg::Optional::NO, "The bitcoin address to be associated with a label."},
                    {"label", RPCArg::Type::STR, RPCArg::Optional::NO, "The label to assign to the address."},
                },
                RPCResult{RPCResult::Type::NONE, "", ""},
                RPCExamples{
                    HelpExampleCli("setlabel", "\"" + EXAMPLE_ADDRESS[0] + "\" \"tabby\"")
            + HelpExampleRpc("setlabel", "\"" + EXAMPLE_ADDRESS[0] + "\", \"tabby\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    LOCK(pwallet->cs_wallet);

    CTxDestination dest = DecodeDestination(request.params[0].get_str());
    if (!IsValidDestination(dest)) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid Bitcoin address");
    }

    const std::string label{LabelFromValue(request.params[1])};

    if (pwallet->IsMine(dest)) {
        pwallet->SetAddressBook(dest, label, AddressPurpose::RECEIVE);
    } else {
        pwallet->SetAddressBook(dest, label, AddressPurpose::SEND);
    }

    return UniValue::VNULL;
},
    };
}